

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagged_union.hpp
# Opt level: O0

void __thiscall
type_safe::tagged_union<int,_evil_variant_test_type>::emplace<int>
          (tagged_union<int,_evil_variant_test_type> *this)

{
  undefined4 *puVar1;
  type_id index;
  tagged_union<int,_evil_variant_test_type> *this_local;
  
  puVar1 = (undefined4 *)detail::aligned_union<int,_evil_variant_test_type>::get(&this->storage_);
  *puVar1 = 0;
  (this->cur_type_).
  super_strong_typedef<type_safe::tagged_union<int,_evil_variant_test_type>::type_id,_unsigned_long>
  .value_ = 1;
  return;
}

Assistant:

void emplace(union_type<T>, Args&&... args)
    {
        constexpr auto index = type_id(union_type<T>{});
        // MSVC doesn't like operator!= of the strong typedef here, for some reason...
        static_assert(get(index) != get(invalid_type), "T must not be stored in variant");
        static_assert(std::is_constructible<T, Args&&...>::value,
                      "T not constructible from arguments");

        ::new (storage_.get()) T(std::forward<Args>(args)...);
        cur_type_ = index;
    }